

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O3

void __thiscall
Assimp::PretransformVertices::CountVerticesAndFaces
          (PretransformVertices *this,aiScene *pcScene,aiNode *pcNode,uint iMat,uint iVFormat,
          uint *piFaces,uint *piVertices)

{
  aiMesh *pcMesh;
  uint uVar1;
  ulong uVar3;
  aiBone **ppaVar2;
  
  if (pcNode->mNumMeshes != 0) {
    uVar3 = 0;
    do {
      pcMesh = pcScene->mMeshes[pcNode->mMeshes[uVar3]];
      if (pcMesh->mMaterialIndex == iMat) {
        ppaVar2 = pcMesh->mBones;
        if (ppaVar2 == (aiBone **)0x0) {
          uVar1 = GetMeshVFormatUnique(pcMesh);
          ppaVar2 = (aiBone **)(ulong)uVar1;
          pcMesh->mBones = (aiBone **)(ulong)uVar1;
        }
        if ((uint)ppaVar2 == iVFormat) {
          *piVertices = *piVertices + pcMesh->mNumVertices;
          *piFaces = *piFaces + pcMesh->mNumFaces;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < pcNode->mNumMeshes);
  }
  if (pcNode->mNumChildren != 0) {
    uVar3 = 0;
    do {
      CountVerticesAndFaces(this,pcScene,pcNode->mChildren[uVar3],iMat,iVFormat,piFaces,piVertices);
      uVar3 = uVar3 + 1;
    } while (uVar3 < pcNode->mNumChildren);
  }
  return;
}

Assistant:

void PretransformVertices::CountVerticesAndFaces(const aiScene *pcScene, const aiNode *pcNode, unsigned int iMat,
		unsigned int iVFormat, unsigned int *piFaces, unsigned int *piVertices) const {
	for (unsigned int i = 0; i < pcNode->mNumMeshes; ++i) {
		aiMesh *pcMesh = pcScene->mMeshes[pcNode->mMeshes[i]];
		if (iMat == pcMesh->mMaterialIndex && iVFormat == GetMeshVFormat(pcMesh)) {
			*piVertices += pcMesh->mNumVertices;
			*piFaces += pcMesh->mNumFaces;
		}
	}
	for (unsigned int i = 0; i < pcNode->mNumChildren; ++i) {
		CountVerticesAndFaces(pcScene, pcNode->mChildren[i], iMat,
				iVFormat, piFaces, piVertices);
	}
}